

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_flt_ldst(DisasContext_conflict6 *ctx,uint32_t opc,int ft,TCGv_i64 t0)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 fp0_3;
  TCGv_i64 fp0_2;
  TCGv_i32 fp0_1;
  TCGv_i32 fp0;
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t0_local;
  int ft_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (opc == 0xc4000000) {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_qemu_ld_i32_mips64el
              (tcg_ctx_00,pTVar1,t0,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_LESL);
    gen_store_fpr32(ctx,pTVar1,ft);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  else if (opc == 0xd4000000) {
    pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_qemu_ld_i64_mips64el
              (tcg_ctx_00,pTVar2,t0,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
    gen_store_fpr64(ctx,pTVar2,ft);
    tcg_temp_free_i64(tcg_ctx_00,pTVar2);
  }
  else if (opc == 0xe4000000) {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    gen_load_fpr32(ctx,pTVar1,ft);
    tcg_gen_qemu_st_i32_mips64el
              (tcg_ctx_00,pTVar1,t0,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_32);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  else if (opc == 0xf4000000) {
    pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_fpr64(ctx,pTVar2,ft);
    tcg_gen_qemu_st_i64_mips64el
              (tcg_ctx_00,pTVar2,t0,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
    tcg_temp_free_i64(tcg_ctx_00,pTVar2);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void gen_flt_ldst(DisasContext *ctx, uint32_t opc, int ft,
                         TCGv t0)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /*
     * Don't do NOP if destination is zero: we must perform the actual
     * memory access.
     */
    switch (opc) {
    case OPC_LWC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_qemu_ld_i32(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TESL |
                                ctx->default_tcg_memop_mask);
            gen_store_fpr32(ctx, fp0, ft);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_SWC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
            gen_load_fpr32(ctx, fp0, ft);
            tcg_gen_qemu_st_i32(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEUL |
                                ctx->default_tcg_memop_mask);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_LDC1:
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ |
                                ctx->default_tcg_memop_mask);
            gen_store_fpr64(ctx, fp0, ft);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    case OPC_SDC1:
        {
            TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
            gen_load_fpr64(ctx, fp0, ft);
            tcg_gen_qemu_st_i64(tcg_ctx, fp0, t0, ctx->mem_idx, MO_TEQ |
                                ctx->default_tcg_memop_mask);
            tcg_temp_free_i64(tcg_ctx, fp0);
        }
        break;
    default:
        MIPS_INVAL("flt_ldst");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}